

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ccallback.c
# Opt level: O3

void * lj_ccallback_new(CTState *cts,CType *ct,GCfunc *fn)

{
  uint uVar1;
  undefined4 uVar2;
  CType *pCVar3;
  GCtab *t;
  uint uVar4;
  undefined8 *__addr;
  CTypeID1 *p;
  TValue *pTVar5;
  ulong uVar6;
  int iVar7;
  undefined8 *puVar8;
  uint uVar9;
  char cVar10;
  ushort uVar11;
  undefined8 *puVar12;
  undefined1 uVar13;
  uint uVar14;
  GCobj *o;
  MSize MVar15;
  ulong uVar16;
  
  uVar1 = ct->info;
  if (((uVar1 & 0xf0000000) == 0x20000000) && (ct->size == 8)) {
    pCVar3 = cts->tab;
    uVar16 = (ulong)((uVar1 & 0xffff) << 4);
    uVar9 = *(uint *)((long)&pCVar3->info + uVar16);
    if ((uVar9 & 0xf0000000) == 0x60000000) {
      uVar6 = (ulong)((uVar9 & 0xffff) << 4);
      uVar14 = *(uint *)((long)&pCVar3->info + uVar6);
      uVar11 = *(ushort *)((long)&pCVar3->sib + uVar16);
      uVar4 = uVar14 >> 0x1c;
      if ((uVar4 < 6) && ((0x34U >> uVar4 & 1) != 0)) {
        if ((uVar9 >> 0x17 & 1) != 0) {
          return (void *)0x0;
        }
      }
      else {
        if (0xfffffff < uVar14) {
          return (void *)0x0;
        }
        if ((uVar9 >> 0x17 & 1) != 0) {
          return (void *)0x0;
        }
        if (8 < *(uint *)((long)&pCVar3->size + uVar6)) {
          return (void *)0x0;
        }
      }
      if (uVar11 != 0) {
        iVar7 = 0;
        do {
          uVar16 = (ulong)((pCVar3[uVar11].info & 0xffff) << 4);
          uVar9 = *(uint *)((long)&pCVar3->info + uVar16);
          uVar14 = uVar9 >> 0x1c;
          if ((uVar14 != 2) && (uVar14 != 5)) {
            if (0xfffffff < uVar9) {
              return (void *)0x0;
            }
            if (8 < *(uint *)((long)&pCVar3->size + uVar16)) {
              return (void *)0x0;
            }
          }
          if (0xf < iVar7) {
            return (void *)0x0;
          }
          iVar7 = iVar7 + 1;
          uVar11 = pCVar3[uVar11].sib;
        } while (uVar11 != 0);
      }
      p = (cts->cb).cbid;
      uVar9 = (cts->cb).topid;
      uVar6 = (ulong)uVar9;
      uVar14 = (cts->cb).sizeid;
      iVar7 = uVar14 - uVar9;
      uVar16 = uVar6;
      if (uVar9 <= uVar14 && iVar7 != 0) {
        do {
          if (p[uVar16] == 0) {
            uVar6 = uVar16 & 0xffffffff;
            goto LAB_0011e667;
          }
          uVar16 = uVar16 + 1;
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
        uVar6 = (ulong)uVar14;
      }
      if (0x39f < (uint)uVar6) {
LAB_0011e6ea:
        lj_err_caller(cts->L,LJ_ERR_FFI_CBACKOV);
      }
      if ((cts->cb).mcode == (void *)0x0) {
        uVar9 = 0;
        __addr = (undefined8 *)mmap64((void *)0x0,0x1000,3,0x22,-1,0);
        if (__addr == (undefined8 *)0xffffffffffffffff) goto LAB_0011e6ea;
        (cts->cb).mcode = __addr;
        uVar2 = *(undefined4 *)&cts->g;
        *__addr = lj_vm_ffi_callback;
        puVar8 = __addr + 1;
        do {
          *(undefined1 *)puVar8 = 0xb0;
          *(char *)((long)puVar8 + 1) = (char)uVar9;
          if ((uVar9 & 0x1f) == 0x1f) {
            *(char *)((long)puVar8 + 4) = (char)(uVar9 >> 8);
            *(undefined1 *)((long)puVar8 + 5) = 0xbd;
            *(undefined4 *)((long)puVar8 + 6) = uVar2;
            *(undefined2 *)((long)puVar8 + 10) = 0x25ff;
            puVar12 = puVar8 + 2;
            *(int *)((long)puVar8 + 0xc) = (int)__addr - (int)puVar12;
            cVar10 = -0x4c;
            uVar13 = 0x55;
          }
          else {
            cVar10 = ((char)(uVar9 & 0x1f) << 2 ^ 0x7cU) - 2;
            puVar12 = (undefined8 *)((long)puVar8 + 4);
            uVar13 = 0xeb;
          }
          *(undefined1 *)((long)puVar8 + 2) = uVar13;
          *(char *)((long)puVar8 + 3) = cVar10;
          uVar9 = uVar9 + 1;
          puVar8 = puVar12;
        } while (uVar9 != 0x3a0);
        mprotect(__addr,0x1000,5);
        uVar14 = (cts->cb).sizeid;
      }
      uVar14 = uVar14 * 2;
      MVar15 = 8;
      if (8 < uVar14) {
        MVar15 = uVar14;
      }
      if (0x39f < MVar15) {
        MVar15 = 0x3a0;
      }
      p = (CTypeID1 *)lj_mem_realloc(cts->L,p,uVar14,MVar15 * 2);
      (cts->cb).sizeid = MVar15;
      (cts->cb).cbid = p;
      memset(p + uVar6,0,(ulong)(MVar15 - (uint)uVar6) * 2);
      uVar16 = uVar6;
LAB_0011e667:
      p[uVar6] = (CTypeID1)uVar1;
      uVar1 = (uint)uVar16;
      (cts->cb).topid = uVar1 + 1;
      t = cts->miscmap;
      if (uVar1 < t->asize) {
        pTVar5 = (TValue *)((ulong)(t->array).ptr32 + (long)(int)uVar1 * 8);
      }
      else {
        pTVar5 = lj_tab_setinth(cts->L,t,uVar1);
      }
      (pTVar5->u32).lo = (uint32_t)fn;
      (pTVar5->field_2).it = 0xfffffff7;
      if ((t->marked & 4) != 0) {
        uVar6 = (ulong)(cts->L->glref).ptr32;
        t->marked = t->marked & 0xfb;
        (t->gclist).gcptr32 = *(uint32_t *)(uVar6 + 0x3c);
        *(int *)(uVar6 + 0x3c) = (int)t;
      }
      return (void *)((ulong)(((uint)(uVar16 >> 5) & 0x7ffffff) * 0xc + uVar1 * 4 + 8) +
                     (long)(cts->cb).mcode);
    }
  }
  return (void *)0x0;
}

Assistant:

void *lj_ccallback_new(CTState *cts, CType *ct, GCfunc *fn)
{
  ct = callback_checkfunc(cts, ct);
  if (ct) {
    MSize slot = callback_slot_new(cts, ct);
    GCtab *t = cts->miscmap;
    setfuncV(cts->L, lj_tab_setint(cts->L, t, (int32_t)slot), fn);
    lj_gc_anybarriert(cts->L, t);
    return callback_slot2ptr(cts, slot);
  }
  return NULL;  /* Bad conversion. */
}